

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckAspectRatio.cpp
# Opt level: O0

int CheckAspectRatio(double smallest_ratio,int x,int y,int z,char *what,bool DoIo)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  double current_ratio;
  bool DoIo_local;
  char *what_local;
  int local_20;
  int z_local;
  int y_local;
  int x_local;
  double smallest_ratio_local;
  
  what_local._4_4_ = z;
  local_20 = y;
  z_local = x;
  _y_local = smallest_ratio;
  piVar3 = std::min<int>(&z_local,&local_20);
  piVar3 = std::min<int>(piVar3,(int *)((long)&what_local + 4));
  iVar1 = *piVar3;
  piVar3 = std::max<int>(&z_local,&local_20);
  piVar3 = std::max<int>(piVar3,(int *)((long)&what_local + 4));
  iVar2 = *piVar3;
  if (_y_local <= (double)iVar1 / (double)iVar2) {
    smallest_ratio_local._4_4_ = 0;
  }
  else {
    if (DoIo) {
      poVar4 = std::operator<<((ostream *)HPCG_fout,"The ");
      poVar4 = std::operator<<(poVar4,what);
      poVar4 = std::operator<<(poVar4," sizes (");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,z_local);
      poVar4 = std::operator<<(poVar4,",");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_20);
      poVar4 = std::operator<<(poVar4,",");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,what_local._4_4_);
      poVar4 = std::operator<<(poVar4,") are invalid because the ratio min(x,y,z)/max(x,y,z)=");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(double)iVar1 / (double)iVar2);
      poVar4 = std::operator<<(poVar4," is too small (at least ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,_y_local);
      poVar4 = std::operator<<(poVar4," is required).");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)HPCG_fout,
                               "The shape should resemble a 3D cube. Please adjust and try again.");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::ostream::flush();
    }
    smallest_ratio_local._4_4_ = 0x7f;
  }
  return smallest_ratio_local._4_4_;
}

Assistant:

int
CheckAspectRatio(double smallest_ratio, int x, int y, int z, const char *what, bool DoIo) {
  double current_ratio = std::min(std::min(x, y), z) / double(std::max(std::max(x, y), z));

  if (current_ratio < smallest_ratio) { // ratio of the smallest to the largest
    if (DoIo) {
      HPCG_fout << "The " << what << " sizes (" << x << "," << y << "," << z <<
        ") are invalid because the ratio min(x,y,z)/max(x,y,z)=" << current_ratio <<
        " is too small (at least " << smallest_ratio << " is required)." << std::endl;
      HPCG_fout << "The shape should resemble a 3D cube. Please adjust and try again." << std::endl;
      HPCG_fout.flush();
    }

#ifndef HPCG_NO_MPI
    MPI_Abort(MPI_COMM_WORLD, 127);
#endif

    return 127;
  }

  return 0;
}